

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,longlong value)

{
  char *__last;
  vector<wchar_t,_std::allocator<wchar_t>_> *this_00;
  iterator __position;
  bool bVar1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  wchar_t local_38 [8];
  
  uVar5 = -value;
  if (0 < value) {
    uVar5 = value;
  }
  lVar6 = 0x3f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  uVar8 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar7 = (&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar8];
  if (value < 0) {
    local_38[0] = L'-';
    this_00 = (this->out_).container;
    __position._M_current =
         (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wchar_t,_std::allocator<wchar_t>_>::_M_realloc_insert<wchar_t>
                (this_00,__position,local_38);
    }
    else {
      *__position._M_current = L'-';
      (this_00->super__Vector_base<wchar_t,_std::allocator<wchar_t>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  __last = (char *)((long)local_38 + (ulong)((uVar8 - (uVar5 < uVar7)) + 1));
  pcVar3 = __last;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar5 * -100) * 2)
      ;
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  bVar2.container = (this->out_).container;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar6 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar6 = -2;
  }
  pcVar3[lVar6] = bVar4;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    ((char *)local_38,__last,bVar2);
  (this->out_).container = bVar2.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }